

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O3

void __thiscall cubeb_async_logger::~cubeb_async_logger(cubeb_async_logger *this)

{
  __pointer_type prVar1;
  _Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_> _Var2;
  
  if ((this->msg_queue)._M_b._M_p != (__pointer_type)0x0) {
    prVar1 = (this->msg_queue)._M_b._M_p;
    if ((prVar1 != (__pointer_type)0x0) &&
       (_Var2.super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl =
             (prVar1->data_)._M_t.
             super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
             _M_t.
             super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
             super__Head_base<0UL,_cubeb_log_message_*,_false>,
       _Var2.super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl !=
       (cubeb_log_message *)0x0)) {
      operator_delete__((void *)_Var2.super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl
                       );
    }
    operator_delete(prVar1,0x18);
  }
  if ((this->logging_thread)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~cubeb_async_logger()
  {
    assert(logging_thread.get_id() == std::thread::id() &&
           (g_cubeb_log_callback == cubeb_noop_log_callback ||
            !g_cubeb_log_callback));
    if (msg_queue.load()) {
      delete msg_queue.load();
    }
  }